

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_storage_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  io_service *piVar1;
  ptime pVar2;
  service srv;
  deadline_timer timer;
  service local_50 [8];
  ptime local_48;
  deadline_timer local_38 [40];
  
  cppcms::service::service(local_50,argc,argv);
  piVar1 = (io_service *)cppcms::service::get_io_service();
  booster::aio::deadline_timer::deadline_timer(local_38,piVar1);
  local_48.sec = 1;
  local_48.nsec = 0;
  booster::ptime::normalize(&local_48);
  pVar2._8_8_ = local_48.sec;
  pVar2.sec = (longlong)local_38;
  booster::aio::deadline_timer::expires_from_now(pVar2);
  booster::callback<void_(const_std::error_code_&)>::callback<stopper>
            ((callback<void_(const_std::error_code_&)> *)&local_48,local_50);
  booster::aio::deadline_timer::async_wait((callback *)local_38);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_48);
  cppcms::service::run();
  booster::aio::deadline_timer::~deadline_timer(local_38);
  cppcms::service::~service(local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc,char **argv)
{

	try {
		cppcms::service srv(argc,argv);

		booster::aio::deadline_timer timer(srv.get_io_service());
		timer.expires_from_now(booster::ptime::seconds(1));
		timer.async_wait(stopper(&srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr<< "Failed: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}